

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::DTDScanner::scanAttValue
          (DTDScanner *this,XMLCh *attrName,XMLBuffer *toFill,AttTypes type)

{
  XMLSize_t XVar1;
  XMLByte XVar2;
  ulong uVar3;
  XMLSize_t XVar4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  XMLCh XVar8;
  XMLCh XVar9;
  XMLBuffer *pXVar10;
  XMLBuffer *pXVar11;
  bool bVar12;
  EntityExpRes EVar13;
  ulong uVar14;
  UnexpectedEOFException *this_00;
  bool escaped;
  XMLCh nextCh;
  XMLCh secondCh;
  XMLCh quoteCh;
  XMLCh tmpBuf [9];
  bool local_77;
  XMLCh local_76;
  int local_74;
  int local_70;
  XMLCh local_6c;
  XMLCh local_6a;
  ulong local_68;
  XMLBuffer *local_60;
  AttTypes local_54;
  XMLCh *local_50;
  XMLCh local_48 [12];
  
  toFill->fIndex = 0;
  local_54 = type;
  local_50 = attrName;
  bVar12 = ReaderMgr::skipIfQuote(this->fReaderMgr,&local_6a);
  if (!bVar12) {
    return false;
  }
  uVar3 = this->fReaderMgr->fCurReader->fReaderNum;
  local_6c = L'\0';
  local_74 = 1;
  local_68 = 0;
  local_70 = local_74;
  local_60 = toFill;
  bVar12 = false;
LAB_0030ad07:
  bVar7 = bVar12;
  local_76 = ReaderMgr::getNextChar(this->fReaderMgr);
  if (local_76 == L'\0') {
    this_00 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
    UnexpectedEOFException::UnexpectedEOFException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/DTD/DTDScanner.cpp"
               ,0x313,Gen_UnexpectedEOF,this->fMemoryManager);
    __cxa_throw(this_00,&UnexpectedEOFException::typeinfo,XMLException::~XMLException);
  }
  if (local_76 == local_6a) {
    uVar14 = this->fReaderMgr->fCurReader->fReaderNum;
    bVar12 = uVar3 == uVar14;
    if (bVar12) {
      return bVar12;
    }
    if (uVar14 <= uVar3 && !bVar12) {
      XMLScanner::emitError(this->fScanner,PartialMarkupInEntity);
      return bVar12;
    }
  }
  local_77 = false;
  if (local_76 == L'&') goto code_r0x0030ad52;
  if ((local_76 & 0xfc00U) == 0xd800) {
    bVar6 = true;
    if (bVar7) {
      XMLScanner::emitError(this->fScanner,Expected2ndSurrogateChar);
      bVar6 = bVar7;
    }
  }
  else {
    if (bVar7) {
      if ((ushort)(local_76 + L'\x2000') < 0xfc00) {
        XMLScanner::emitError(this->fScanner,Expected2ndSurrogateChar);
      }
    }
    else if ((this->fReaderMgr->fCurReader->fgCharCharsTable[(ushort)local_76] & 0x40) == 0) {
      XMLString::binToText((uint)(ushort)local_76,local_48,8,0x10,this->fMemoryManager);
      XMLScanner::emitError
                (this->fScanner,InvalidCharacterInAttrValue,local_50,local_48,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    bVar6 = false;
  }
  goto LAB_0030ae1e;
code_r0x0030ad52:
  EVar13 = scanEntityRef(this,&local_76,&local_6c,&local_77);
  bVar12 = false;
  bVar6 = bVar7;
  if (EVar13 != EntityExp_Returned) goto LAB_0030ad07;
LAB_0030ae1e:
  XVar8 = local_76;
  bVar7 = local_77;
  if (local_76 == L'<' && local_77 == false) {
    XMLScanner::emitError
              (this->fScanner,BracketInAttrValue,local_50,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
  }
  pXVar10 = local_60;
  bVar12 = bVar6;
  if (local_54 == AttTypes_Min) {
    if (((bVar7 == false) && ((ushort)XVar8 < 0xe)) &&
       ((0x2600U >> ((ushort)XVar8 & 0x1f) & 1) != 0)) {
      local_76 = L' ';
    }
  }
  else {
    XVar2 = this->fReaderMgr->fCurReader->fgCharCharsTable[(ushort)XVar8];
    bVar5 = (byte)((ushort)XVar8 >> 8);
    uVar14 = (ulong)CONCAT11(bVar5,XVar2);
    if (local_70 == 0) {
      local_70 = 0;
      if ((char)XVar2 < '\0') goto LAB_0030ad07;
      if ((local_68 & 1) == 0) {
        local_68 = CONCAT71((uint7)bVar5,1);
        local_74 = 1;
        goto LAB_0030af21;
      }
      if (local_60->fIndex == local_60->fCapacity) {
        local_70 = 0;
        XMLBuffer::ensureCapacity(local_60,1);
      }
      uVar14 = pXVar10->fIndex;
      pXVar10->fIndex = uVar14 + 1;
      pXVar10->fBuffer[uVar14] = L' ';
    }
    else {
      local_70 = 0;
      if ((char)XVar2 < '\0') goto LAB_0030ad07;
    }
    local_68 = CONCAT71((int7)(uVar14 >> 8),1);
    local_74 = 1;
  }
LAB_0030af21:
  pXVar10 = local_60;
  XVar8 = local_76;
  if (local_60->fIndex == local_60->fCapacity) {
    local_70 = local_74;
    XMLBuffer::ensureCapacity(local_60,1);
  }
  pXVar11 = local_60;
  XVar9 = local_6c;
  XVar4 = pXVar10->fIndex;
  XVar1 = XVar4 + 1;
  pXVar10->fIndex = XVar1;
  pXVar10->fBuffer[XVar4] = XVar8;
  local_70 = local_74;
  if (local_6c != L'\0') {
    if (XVar1 == local_60->fCapacity) {
      XMLBuffer::ensureCapacity(local_60,1);
    }
    XVar1 = pXVar11->fIndex;
    pXVar11->fIndex = XVar1 + 1;
    pXVar11->fBuffer[XVar1] = XVar9;
    local_6c = L'\0';
    local_70 = local_74;
  }
  goto LAB_0030ad07;
}

Assistant:

bool DTDScanner::scanAttValue(const   XMLCh* const        attrName
                                ,       XMLBuffer&          toFill
                                , const XMLAttDef::AttTypes type)
{
    enum States
    {
        InWhitespace
        , InContent
    };

    // Reset the target buffer
    toFill.reset();

    // Get the next char which must be a single or double quote
    XMLCh quoteCh;
    if (!fReaderMgr->skipIfQuote(quoteCh))
        return false;

    //
    //  We have to get the current reader because we have to ignore closing
    //  quotes until we hit the same reader again.
    //
    const XMLSize_t curReader = fReaderMgr->getCurrentReaderNum();

    //
    //  Loop until we get the attribute value. Note that we use a double
    //  loop here to avoid the setup/teardown overhead of the exception
    //  handler on every round.
    //
    XMLCh   nextCh;
    XMLCh   secondCh = 0;
    States  curState = InContent;
    bool    firstNonWS = false;
    bool    gotLeadingSurrogate = false;
    bool    escaped;
    while (true)
    {
    try
    {
        while(true)
        {
            nextCh = fReaderMgr->getNextChar();

            if (!nextCh)
                ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);

            // Check for our ending quote in the same entity
            if (nextCh == quoteCh)
            {
                if (curReader == fReaderMgr->getCurrentReaderNum())
                    return true;

                // Watch for spillover into a previous entity
                if (curReader > fReaderMgr->getCurrentReaderNum())
                {
                    fScanner->emitError(XMLErrs::PartialMarkupInEntity);
                    return false;
                }
            }

            //
            //  Check for an entity ref now, before we let it affect our
            //  whitespace normalization logic below. We ignore the empty flag
            //  in this one.
            //
            escaped = false;
            if (nextCh == chAmpersand)
            {
                if (scanEntityRef(nextCh, secondCh, escaped) != EntityExp_Returned)
                {
                    gotLeadingSurrogate = false;
                    continue;
                }
            }
            else if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
            {
                // Check for correct surrogate pairs
                if (gotLeadingSurrogate)
                    fScanner->emitError(XMLErrs::Expected2ndSurrogateChar);
                else
                    gotLeadingSurrogate = true;
            }
             else
            {
                if (gotLeadingSurrogate)
                {
                    if ((nextCh < 0xDC00) || (nextCh > 0xDFFF))
                        fScanner->emitError(XMLErrs::Expected2ndSurrogateChar);
                }
                // Its got to at least be a valid XML character
                else if (!fReaderMgr->getCurrentReader()->isXMLChar(nextCh))
                {
                    XMLCh tmpBuf[9];
                    XMLString::binToText
                    (
                        nextCh
                        , tmpBuf
                        , 8
                        , 16
                        , fMemoryManager
                    );
                    fScanner->emitError
                    (
                        XMLErrs::InvalidCharacterInAttrValue
                        , attrName
                        , tmpBuf
                    );
                }

                gotLeadingSurrogate = false;
            }

            //
            //  If its not escaped, then make sure its not a < character, which
            //  is not allowed in attribute values.
            //
            if (!escaped && (nextCh == chOpenAngle))
                fScanner->emitError(XMLErrs::BracketInAttrValue, attrName);

            //
            //  If the attribute is a CDATA type we do simple replacement of
            //  tabs and new lines with spaces, if the character is not escaped
            //  by way of a char ref.
            //
            //  Otherwise, we do the standard non-CDATA normalization of
            //  compressing whitespace to single spaces and getting rid of
            //  leading and trailing whitespace.
            //
            if (type == XMLAttDef::CData)
            {
                if (!escaped)
                {
                    if ((nextCh == 0x09) || (nextCh == 0x0A) || (nextCh == 0x0D))
                        nextCh = chSpace;
                }
            }
             else
            {
                if (curState == InWhitespace)
                {
                    if (!fReaderMgr->getCurrentReader()->isWhitespace(nextCh))
                    {
                        if (firstNonWS)
                            toFill.append(chSpace);
                        curState = InContent;
                        firstNonWS = true;
                    }
                     else
                    {
                        continue;
                    }
                }
                 else if (curState == InContent)
                {
                    if (fReaderMgr->getCurrentReader()->isWhitespace(nextCh))
                    {
                        curState = InWhitespace;
                        continue;
                    }
                    firstNonWS = true;
                }
            }

            // Else add it to the buffer
            toFill.append(nextCh);

            if (secondCh)
            {
                toFill.append(secondCh);
                secondCh=0;
            }
        }
    }

    catch(const EndOfEntityException&)
    {
        // Just eat it and continue.
        gotLeadingSurrogate = false;
        escaped = false;
    }
    }
    return true;
}